

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::SetObjectMarkedBit
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,void *objectAddress)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint bitIndex;
  
  if ((this->super_HeapBlock).address == (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x322,"(this->address != nullptr)","this->address != nullptr");
    if (!bVar2) goto LAB_006aec63;
    *puVar3 = 0;
  }
  if ((this->super_HeapBlock).segment == (Segment *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x323,"(this->segment != nullptr)","this->segment != nullptr");
    if (!bVar2) goto LAB_006aec63;
    *puVar3 = 0;
  }
  if (((ulong)objectAddress & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                       ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                       "HeapInfo::IsAlignedAddress(objectAddress)");
    if (!bVar2) goto LAB_006aec63;
    *puVar3 = 0;
  }
  bitIndex = (uint)((ulong)objectAddress >> 4) & 0xff;
  bVar2 = IsValidBitIndex(this,bitIndex);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x326,"(IsValidBitIndex(bitIndex))","IsValidBitIndex(bitIndex)");
    if (!bVar2) {
LAB_006aec63:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  BVStatic<256UL>::Set(this->markBits,bitIndex);
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::SetObjectMarkedBit(void* objectAddress)
{
    Assert(this->address != nullptr);
    Assert(this->segment != nullptr);

    uint bitIndex = GetAddressBitIndex(objectAddress);
    Assert(IsValidBitIndex(bitIndex));

    this->GetMarkedBitVector()->Set(bitIndex);
}